

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::testClipDistance
          (TestStatus *__return_storage_ptr__,ClipDistance *this,Context *context,
          CaseDefinition caseDef)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  InstanceInterface *vk;
  ProgramCollection<vk::ProgramBinary> *pPVar4;
  ProgramBinary *pPVar5;
  TestContext *this_00;
  MessageBuilder *pMVar6;
  TestLog *pTVar7;
  allocator<char> local_f51;
  string local_f50;
  byte local_f2b;
  byte local_f2a;
  allocator<char> local_f29;
  string local_f28;
  Vector<float,_4> local_f08;
  Vector<float,_4> local_ef8;
  Vector<int,_2> local_ee8;
  ConstPixelBufferAccess local_ee0;
  int local_eb8;
  int local_eb4;
  int guardPixels;
  int expectedClippedPixels;
  IVec2 clipRegion;
  Vector<float,_4> local_e98;
  ConstPixelBufferAccess local_e88;
  int local_e5c;
  undefined1 local_e58 [4];
  int numBlackPixels;
  VulkanDrawContext drawContext;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  DrawState drawState;
  MessageBuilder local_ab8;
  MessageBuilder local_938;
  TestLog *local_7b8;
  TestLog *log;
  Vector<float,_4> local_79c;
  Vector<float,_4> local_78c;
  Vector<float,_4> local_77c;
  Vector<float,_4> local_76c;
  Vector<float,_4> local_75c;
  float local_74c;
  int local_748;
  float x;
  int i;
  float dx;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  int numBars;
  Shader local_700;
  allocator<char> local_6e9;
  string local_6e8;
  Shader local_6c8;
  allocator<char> local_6b1;
  string local_6b0;
  Shader local_690;
  allocator<char> local_679;
  string local_678;
  Shader local_658;
  allocator<char> local_641;
  string local_640;
  Shader local_620;
  undefined1 local_610 [8];
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_591;
  string local_590;
  uint local_56c;
  FeatureFlags requirements;
  undefined1 local_230 [8];
  VkPhysicalDeviceLimits limits;
  VkPhysicalDevice physDevice;
  InstanceInterface *vki;
  Context *context_local;
  CaseDefinition caseDef_local;
  
  caseDef_local._0_8_ = caseDef._0_8_;
  caseDef_local._8_8_ = __return_storage_ptr__;
  vk = Context::getInstanceInterface((Context *)this);
  limits.nonCoherentAtomSize = (VkDeviceSize)Context::getPhysicalDevice((Context *)this);
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)&stack0xfffffffffffffa98,vk,
             (VkPhysicalDevice)limits.nonCoherentAtomSize);
  memcpy(local_230,&stack0xfffffffffffffbc0,0x1f8);
  local_56c = 0;
  if (0 < (int)caseDef_local.topology) {
    local_56c = 0x200;
  }
  if (0 < (int)caseDef_local._4_4_) {
    local_56c = local_56c | 0x400;
  }
  if (((ulong)context & 0x10000000000) != 0) {
    local_56c = local_56c | 1;
  }
  if (((ulong)context & 0x1000000000000) != 0) {
    local_56c = local_56c | 2;
  }
  requireFeatures(vk,(VkPhysicalDevice)limits.nonCoherentAtomSize,local_56c);
  if (((int)caseDef_local.topology < 1) || (7 < limits.timestampComputeAndGraphics)) {
    if (((int)caseDef_local._4_4_ < 1) || (7 < (uint)limits.timestampPeriod)) {
      if (((int)caseDef_local._4_4_ < 1) || (7 < limits.maxClipDistances)) {
        std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::vector
                  ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                   local_610);
        pPVar4 = Context::getBinaryCollection((Context *)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"vert",&local_641);
        pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_640);
        drawutil::Shader::Shader(&local_620,VK_SHADER_STAGE_VERTEX_BIT,pPVar5);
        std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
                  ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                   local_610,&local_620);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator(&local_641);
        pPVar4 = Context::getBinaryCollection((Context *)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"frag",&local_679);
        pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_678);
        drawutil::Shader::Shader(&local_658,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar5);
        std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
                  ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                   local_610,&local_658);
        std::__cxx11::string::~string((string *)&local_678);
        std::allocator<char>::~allocator(&local_679);
        if (((ulong)context & 0x10000000000) != 0) {
          pPVar4 = Context::getBinaryCollection((Context *)this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"tesc",&local_6b1)
          ;
          pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_6b0);
          drawutil::Shader::Shader(&local_690,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar5);
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
                    ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                     local_610,&local_690);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::allocator<char>::~allocator(&local_6b1);
          pPVar4 = Context::getBinaryCollection((Context *)this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"tese",&local_6e9)
          ;
          pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,&local_6e8);
          drawutil::Shader::Shader(&local_6c8,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar5);
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
                    ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                     local_610,&local_6c8);
          std::__cxx11::string::~string((string *)&local_6e8);
          std::allocator<char>::~allocator(&local_6e9);
        }
        if (((ulong)context & 0x1000000000000) != 0) {
          pPVar4 = Context::getBinaryCollection((Context *)this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&numBars,"geom",
                     (allocator<char> *)
                     ((long)&vertices.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,(string *)&numBars);
          drawutil::Shader::Shader(&local_700,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar5);
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
                    ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                     local_610,&local_700);
          std::__cxx11::string::~string((string *)&numBars);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&vertices.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i);
        x = 0.25;
        for (local_748 = 0; local_748 < 8; local_748 = local_748 + 1) {
          local_74c = (float)local_748 * 0.25 + -1.0;
          tcu::Vector<float,_4>::Vector(&local_75c,local_74c,-1.0,0.0,1.0);
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,
                     &local_75c);
          tcu::Vector<float,_4>::Vector(&local_76c,local_74c,1.0,0.0,1.0);
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,
                     &local_76c);
          tcu::Vector<float,_4>::Vector(&local_77c,local_74c + 0.25,-1.0,0.0,1.0);
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,
                     &local_77c);
          tcu::Vector<float,_4>::Vector(&local_78c,local_74c,1.0,0.0,1.0);
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,
                     &local_78c);
          tcu::Vector<float,_4>::Vector(&local_79c,local_74c + 0.25,1.0,0.0,1.0);
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,
                     &local_79c);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)((long)&log + 4),local_74c + 0.25,-1.0,0.0,1.0);
          std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,
                     (value_type *)((long)&log + 4));
        }
        this_00 = Context::getTestContext((Context *)this);
        local_7b8 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&drawState.lineWidth,local_7b8,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&drawState.lineWidth,(char (*) [9])"Drawing ");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(int *)&vertices.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [35])" colored bars, clipping the first ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&caseDef_local);
        pTVar7 = tcu::MessageBuilder::operator<<
                           (pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_ab8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_ab8,(char (*) [7])"Using ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&caseDef_local);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])" ClipDistance(s) and ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&caseDef_local.dynamicIndexing);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])" CullDistance(s)");
        pTVar7 = tcu::MessageBuilder::operator<<
                           (pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_938,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_938,
                            (char (*) [54])"Expecting upper half of the clipped bars to be black.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_938);
        tcu::MessageBuilder::~MessageBuilder(&local_ab8);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&drawState.lineWidth);
        context_local._0_4_ = (VkPrimitiveTopology)context;
        drawutil::DrawState::DrawState
                  ((DrawState *)((long)&drawCallData.vertices + 4),
                   (VkPrimitiveTopology)context_local,0x10,0x10);
        drawutil::DrawCallData::DrawCallData
                  ((DrawCallData *)&vulkanProgram,
                   (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i);
        drawutil::VulkanProgram::VulkanProgram
                  ((VulkanProgram *)
                   &drawContext.m_vertexBuffer.
                    super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
                    .m_data.field_0x8,
                   (vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                   local_610);
        if (((ulong)context & 0x10000000000) != 0) {
          drawState.depthClampEnable = true;
          drawState.blendEnable = false;
          drawState._18_2_ = 0;
        }
        drawutil::VulkanDrawContext::VulkanDrawContext
                  ((VulkanDrawContext *)local_e58,(Context *)this,
                   (DrawState *)((long)&drawCallData.vertices + 4),(DrawCallData *)&vulkanProgram,
                   (VulkanProgram *)
                   &drawContext.m_vertexBuffer.
                    super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>
                    .m_data.field_0x8);
        drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_e58);
        drawutil::VulkanDrawContext::getColorPixels(&local_e88,(VulkanDrawContext *)local_e58);
        tcu::Vector<float,_4>::Vector(&local_e98,0.0,0.0,0.0,1.0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&clipRegion);
        local_e5c = countPixels(&local_e88,&local_e98,(Vec4 *)&clipRegion);
        tcu::Vector<int,_2>::Vector
                  ((Vector<int,_2> *)&guardPixels,(int)(caseDef_local.topology << 4) >> 3,8);
        iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&guardPixels);
        local_eb4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&guardPixels);
        local_eb4 = iVar3 * local_eb4;
        drawutil::VulkanDrawContext::getColorPixels(&local_ee0,(VulkanDrawContext *)local_e58);
        tcu::Vector<int,_2>::Vector(&local_ee8,0,8);
        tcu::Vector<float,_4>::Vector(&local_ef8,0.0,0.0,0.0,1.0);
        tcu::Vector<float,_4>::Vector(&local_f08);
        local_eb8 = countPixels(&local_ee0,&local_ee8,(IVec2 *)&guardPixels,&local_ef8,&local_f08);
        local_f2a = 0;
        local_f2b = 0;
        bVar2 = false;
        bVar1 = false;
        if ((local_e5c == local_eb4) && (local_eb8 == 0)) {
          std::allocator<char>::allocator();
          local_f2a = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_f28,"OK",&local_f29);
          local_f2b = 1;
          tcu::TestStatus::pass(__return_storage_ptr__,&local_f28);
        }
        else {
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f50,"Rendered image(s) are incorrect",&local_f51);
          bVar1 = true;
          tcu::TestStatus::fail(__return_storage_ptr__,&local_f50);
        }
        if (bVar1) {
          std::__cxx11::string::~string((string *)&local_f50);
        }
        if (bVar2) {
          std::allocator<char>::~allocator(&local_f51);
        }
        if ((local_f2b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_f28);
        }
        if ((local_f2a & 1) != 0) {
          std::allocator<char>::~allocator(&local_f29);
        }
        drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_e58);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i);
        std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~vector
                  ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)
                   local_610);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f0,
                   "maxCombinedClipAndCullDistances smaller than the minimum required by the spec",
                   (allocator<char> *)
                   ((long)&shaders.
                           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        tcu::TestStatus::fail(__return_storage_ptr__,&local_5f0);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&shaders.
                           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,
                 "maxCullDistances smaller than the minimum required by the spec",&local_5c9);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_5c8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::allocator<char>::~allocator(&local_5c9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"maxClipDistances smaller than the minimum required by the spec"
               ,&local_591);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testClipDistance (Context& context, const CaseDefinition caseDef)
{
	// Check test requirements
	{
		const InstanceInterface&		vki			= context.getInstanceInterface();
		const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();
		const VkPhysicalDeviceLimits	limits		= getPhysicalDeviceProperties(vki, physDevice).limits;

		FeatureFlags requirements = (FeatureFlags)0;

		if (caseDef.numClipDistances > 0)
			requirements |= FEATURE_SHADER_CLIP_DISTANCE;
		if (caseDef.numCullDistances > 0)
			requirements |= FEATURE_SHADER_CULL_DISTANCE;
		if (caseDef.enableTessellation)
			requirements |= FEATURE_TESSELLATION_SHADER;
		if (caseDef.enableGeometry)
			requirements |= FEATURE_GEOMETRY_SHADER;

		requireFeatures(vki, physDevice, requirements);

		// Check limits for supported features

		if (caseDef.numClipDistances > 0 && limits.maxClipDistances < MAX_CLIP_DISTANCES)
			return tcu::TestStatus::fail("maxClipDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCullDistances < MAX_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCullDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCombinedClipAndCullDistances < MAX_COMBINED_CLIP_AND_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCombinedClipAndCullDistances smaller than the minimum required by the spec");
	}

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));
	if (caseDef.enableTessellation)
	{
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,		context.getBinaryCollection().get("tesc")));
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,	context.getBinaryCollection().get("tese")));
	}
	if (caseDef.enableGeometry)
		shaders.push_back(Shader(VK_SHADER_STAGE_GEOMETRY_BIT,	context.getBinaryCollection().get("geom")));

	const int numBars = MAX_COMBINED_CLIP_AND_CULL_DISTANCES;

	std::vector<Vec4> vertices;
	{
		const float	dx = 2.0f / numBars;
		for (int i = 0; i < numBars; ++i)
		{
			const float x = -1.0f + dx * static_cast<float>(i);

			vertices.push_back(Vec4(x,      -1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));

			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx,  1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));
		}
	}

	tcu::TestLog& log = context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Drawing " << numBars << " colored bars, clipping the first " << caseDef.numClipDistances << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Using " << caseDef.numClipDistances << " ClipDistance(s) and " << caseDef.numCullDistances << " CullDistance(s)" << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Expecting upper half of the clipped bars to be black." << tcu::TestLog::EndMessage;

	DrawState			drawState		(caseDef.topology, RENDER_SIZE, RENDER_SIZE);
	DrawCallData		drawCallData	(vertices);
	VulkanProgram		vulkanProgram	(shaders);

	if (caseDef.enableTessellation)
		drawState.numPatchControlPoints = NUM_PATCH_CONTROL_POINTS;

	VulkanDrawContext	drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	// Count black pixels in the whole image.
	const int numBlackPixels		= countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
	const IVec2	clipRegion			= IVec2(caseDef.numClipDistances * RENDER_SIZE / numBars, RENDER_SIZE / 2);
	const int expectedClippedPixels	= clipRegion.x() * clipRegion.y();
	// Make sure the bottom half has no black pixels (possible if image became corrupted).
	const int guardPixels			= countPixels(drawContext.getColorPixels(), IVec2(0, RENDER_SIZE/2), clipRegion, Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());

	return (numBlackPixels == expectedClippedPixels && guardPixels == 0 ? tcu::TestStatus::pass("OK")
																		: tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}